

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O2

void cmdline_parser_release(gengetopt_args_info *args_info)

{
  ulong uVar1;
  
  free_string_field(&args_info->input_arg);
  free_string_field(&args_info->input_orig);
  free_string_field(&args_info->method_arg);
  free_string_field(&args_info->method_orig);
  free_string_field(&args_info->npoints_orig);
  free_string_field(&args_info->delta_orig);
  for (uVar1 = 0; uVar1 < args_info->inputs_num; uVar1 = uVar1 + 1) {
    free(args_info->inputs[uVar1]);
  }
  if (args_info->inputs_num != 0) {
    free(args_info->inputs);
  }
  args_info->box_given = 0;
  args_info->method_given = 0;
  args_info->npoints_given = 0;
  args_info->delta_given = 0;
  args_info->help_given = 0;
  args_info->version_given = 0;
  args_info->input_given = 0;
  args_info->box_given = 0;
  return;
}

Assistant:

static void
cmdline_parser_release (struct gengetopt_args_info *args_info)
{
  unsigned int i;
  free_string_field (&(args_info->input_arg));
  free_string_field (&(args_info->input_orig));
  free_string_field (&(args_info->method_arg));
  free_string_field (&(args_info->method_orig));
  free_string_field (&(args_info->npoints_orig));
  free_string_field (&(args_info->delta_orig));
  
  
  for (i = 0; i < args_info->inputs_num; ++i)
    free (args_info->inputs [i]);

  if (args_info->inputs_num)
    free (args_info->inputs);

  clear_given (args_info);
}